

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * __thiscall
soul::PaddedStringTable::getRow_abi_cxx11_
          (string *__return_storage_ptr__,PaddedStringTable *this,size_t rowIndex)

{
  ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  unsigned_long *puVar1;
  ulong index;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = ArrayWithPreallocation<soul::ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>,_16UL>
            ::operator[](&this->rows,rowIndex);
  for (index = 0; index < this_00->numActive; index = index + 1) {
    if (index < this_00->numActive - 1) {
      s = ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::operator[](this_00,index);
      puVar1 = ArrayWithPreallocation<unsigned_long,_16UL>::operator[](&this->columnWidths,index);
      padded(&local_50,s,this->numExtraSpaces + (int)*puVar1);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::operator[](this_00,index);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PaddedStringTable::getRow (size_t rowIndex) const
{
    std::string s;
    auto& row = rows[rowIndex];

    for (size_t i = 0; i < row.size(); ++i)
    {
        if (i < row.size() - 1)
            s += padded (row[i], (int) columnWidths[i] + numExtraSpaces);
        else
            s += row[i];
    }

    return s;
}